

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReach.c
# Opt level: O3

DdNode * Abc_NtkInitStateVarMap(DdManager *dd,Abc_Ntk_t *pNtk,int fVerbose)

{
  void *pvVar1;
  DdNode **ppDVar2;
  DdNode **x;
  DdNode **y;
  DdNode *pDVar3;
  Vec_Ptr_t *pVVar4;
  size_t __size;
  DdNode *f;
  long lVar5;
  
  __size = (long)dd->size << 3;
  x = (DdNode **)malloc(__size);
  y = (DdNode **)malloc(__size);
  pDVar3 = dd->one;
  Cudd_Ref(pDVar3);
  pVVar4 = pNtk->vBoxes;
  if (0 < pVVar4->nSize) {
    lVar5 = 0;
    f = pDVar3;
    do {
      pvVar1 = pVVar4->pArray[lVar5];
      pDVar3 = f;
      if ((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 8) {
        ppDVar2 = dd->vars;
        pDVar3 = ppDVar2[pNtk->vPis->nSize + lVar5];
        x[lVar5] = pDVar3;
        y[lVar5] = ppDVar2[pNtk->vCis->nSize + lVar5];
        pDVar3 = Cudd_bddAnd(dd,f,(DdNode *)
                                  ((ulong)(*(long *)((long)pvVar1 + 0x38) != 2) ^ (ulong)pDVar3));
        Cudd_Ref(pDVar3);
        Cudd_RecursiveDeref(dd,f);
        pVVar4 = pNtk->vBoxes;
      }
      lVar5 = lVar5 + 1;
      f = pDVar3;
    } while (lVar5 < pVVar4->nSize);
  }
  Cudd_SetVarMap(dd,x,y,pNtk->nObjCounts[8]);
  if (x != (DdNode **)0x0) {
    free(x);
  }
  if (y != (DdNode **)0x0) {
    free(y);
  }
  Cudd_Deref(pDVar3);
  return pDVar3;
}

Assistant:

DdNode * Abc_NtkInitStateVarMap( DdManager * dd, Abc_Ntk_t * pNtk, int fVerbose )
{
    DdNode ** pbVarsX, ** pbVarsY;
    DdNode * bTemp, * bProd, * bVar;
    Abc_Obj_t * pLatch;
    int i;

    // set the variable mapping for Cudd_bddVarMap()
    pbVarsX = ABC_ALLOC( DdNode *, dd->size );
    pbVarsY = ABC_ALLOC( DdNode *, dd->size );
    bProd = b1;         Cudd_Ref( bProd );
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        pbVarsX[i] = dd->vars[ Abc_NtkPiNum(pNtk) + i ];
        pbVarsY[i] = dd->vars[ Abc_NtkCiNum(pNtk) + i ];
        // get the initial value of the latch
        bVar  = Cudd_NotCond( pbVarsX[i], !Abc_LatchIsInit1(pLatch) );
        bProd = Cudd_bddAnd( dd, bTemp = bProd, bVar );      Cudd_Ref( bProd );
        Cudd_RecursiveDeref( dd, bTemp ); 
    }
    Cudd_SetVarMap( dd, pbVarsX, pbVarsY, Abc_NtkLatchNum(pNtk) );
    ABC_FREE( pbVarsX );
    ABC_FREE( pbVarsY );

    Cudd_Deref( bProd );
    return bProd;
}